

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O3

void phmap::priv::
     map_slot_policy<unsigned_long,phmap::flat_hash_set<unsigned_long,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<unsigned_long>>>
     ::
     transfer<std::allocator<std::pair<unsigned_long_const,phmap::flat_hash_set<unsigned_long,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<unsigned_long>>>>>
               (allocator<std::pair<const_unsigned_long,_phmap::flat_hash_set<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                *alloc,slot_type *new_slot,slot_type *old_slot)

{
  ctrl_t *pcVar1;
  slot_type *psVar2;
  size_t sVar3;
  
  (new_slot->value).first = (old_slot->value).first;
  pcVar1 = (old_slot->value).second.
           super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
           .ctrl_;
  (old_slot->value).second.
  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  .ctrl_ = EmptyGroup()::empty_group;
  (new_slot->value).second.
  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  .ctrl_ = pcVar1;
  psVar2 = (old_slot->value).second.
           super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
           .slots_;
  (old_slot->value).second.
  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  .slots_ = (slot_type *)0x0;
  (new_slot->value).second.
  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  .slots_ = psVar2;
  sVar3 = (old_slot->value).second.
          super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
          .size_;
  (old_slot->value).second.
  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  .size_ = 0;
  (new_slot->value).second.
  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  .size_ = sVar3;
  sVar3 = (old_slot->value).second.
          super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
          .capacity_;
  (old_slot->value).second.
  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  .capacity_ = 0;
  (new_slot->value).second.
  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  .capacity_ = sVar3;
  (new_slot->value).second.
  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  .settings_.
  super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>,_0UL,_false>
  .value = (old_slot->value).second.
           super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
           .settings_.
           super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
           .
           super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>,_0UL,_false>
           .value;
  (old_slot->value).second.
  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  .settings_.
  super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>,_0UL,_false>
  .value = 0;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  ::destroy_slots(&(old_slot->value).second.
                   super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
                 );
  return;
}

Assistant:

static void transfer(Allocator* alloc, slot_type* new_slot,
			                     slot_type* old_slot)
			{
				emplace(new_slot);
				if (kMutableKeys::value) {
					phmap::allocator_traits<Allocator>::construct(
					    *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
				}
				else {
					phmap::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
					        std::move(old_slot->value));
				}
				destroy(alloc, old_slot);
			}